

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O2

int wally_psbt_free(wally_psbt *psbt)

{
  undefined8 in_RSI;
  long lVar1;
  ulong uVar2;
  
  if (psbt != (wally_psbt *)0x0) {
    wally_tx_free(psbt->tx);
    lVar1 = 0;
    for (uVar2 = 0; uVar2 < psbt->num_inputs; uVar2 = uVar2 + 1) {
      psbt_input_free((wally_psbt_input *)((long)&psbt->inputs->utxo + lVar1),SUB81(in_RSI,0));
      lVar1 = lVar1 + 0x110;
    }
    wally_free(psbt->inputs);
    lVar1 = 0;
    for (uVar2 = 0; uVar2 < psbt->num_outputs; uVar2 = uVar2 + 1) {
      psbt_output_free((wally_psbt_output *)((long)&psbt->outputs->redeem_script + lVar1),
                       SUB81(in_RSI,0));
      lVar1 = lVar1 + 0xd0;
    }
    wally_free(psbt->outputs);
    wally_map_clear(&psbt->unknowns);
    clear_and_free(psbt,0x60);
  }
  return 0;
}

Assistant:

int wally_psbt_free(struct wally_psbt *psbt)
{
    size_t i;
    if (psbt) {
        wally_tx_free(psbt->tx);
        for (i = 0; i < psbt->num_inputs; ++i)
            psbt_input_free(&psbt->inputs[i], false);

        wally_free(psbt->inputs);
        for (i = 0; i < psbt->num_outputs; ++i)
            psbt_output_free(&psbt->outputs[i], false);

        wally_free(psbt->outputs);
        wally_map_clear(&psbt->unknowns);
        clear_and_free(psbt, sizeof(*psbt));
    }
    return WALLY_OK;
}